

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O0

void __thiscall bloaty::Options::Options(Options *this)

{
  undefined8 *in_RDI;
  Arena *in_stack_ffffffffffffff98;
  InternalMetadataWithArena *in_stack_ffffffffffffffa0;
  Options *this_00;
  
  google::protobuf::Message::Message((Message *)in_stack_ffffffffffffffa0);
  *in_RDI = &PTR__Options_009156e0;
  google::protobuf::internal::InternalMetadataWithArena::InternalMetadataWithArena
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  memset(in_RDI + 2,0,4);
  google::protobuf::internal::CachedSize::CachedSize((CachedSize *)0x1c2a52);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x1c2a65);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x1c2a7a);
  this_00 = (Options *)(in_RDI + 9);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x1c2a8f);
  google::protobuf::RepeatedPtrField<bloaty::CustomDataSource>::RepeatedPtrField
            ((RepeatedPtrField<bloaty::CustomDataSource> *)0x1c2aa4);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x1c2ab9);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x1c2ad0);
  SharedCtor(this_00);
  return;
}

Assistant:

Options::Options()
  : ::PROTOBUF_NAMESPACE_ID::Message(), _internal_metadata_(nullptr) {
  SharedCtor();
  // @@protoc_insertion_point(constructor:bloaty.Options)
}